

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCallback.cpp
# Opt level: O1

void __thiscall HighsCallback::clear(HighsCallback *this)

{
  _Manager_type p_Var1;
  
  p_Var1 = (this->user_callback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
    (this->user_callback).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->user_callback)._M_invoker = (_Invoker_type)0x0;
  }
  this->user_callback_data = (void *)0x0;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(&this->active,10,false);
  (this->data_out).log_type = -1;
  (this->data_out).running_time = -1.0;
  (this->data_out).simplex_iteration_count = -1;
  (this->data_out).ipm_iteration_count = -1;
  (this->data_out).pdlp_iteration_count = -1;
  (this->data_out).objective_function_value = -INFINITY;
  (this->data_out).mip_node_count = -1;
  (this->data_out).mip_primal_bound = INFINITY;
  (this->data_out).mip_dual_bound = -INFINITY;
  (this->data_out).mip_gap = -1.0;
  (this->data_out).mip_solution = (double *)0x0;
  (this->data_out).cutpool_num_col = 0;
  (this->data_out).cutpool_num_cut = 0;
  (this->data_out).cutpool_num_nz = 0;
  (this->data_out).cutpool_start = (HighsInt *)0x0;
  (this->data_out).cutpool_index = (HighsInt *)0x0;
  (this->data_out).cutpool_value = (double *)0x0;
  (this->data_out).cutpool_lower = (double *)0x0;
  *(undefined8 *)((long)&(this->data_out).cutpool_lower + 4) = 0;
  *(undefined8 *)((long)&(this->data_out).cutpool_upper + 4) = 0;
  (this->data_in).user_interrupt = 0;
  (this->data_in).user_solution = (double *)0x0;
  return;
}

Assistant:

void HighsCallback::clear() {
  this->user_callback = nullptr;
  this->user_callback_data = nullptr;
  this->active.assign(kNumCallbackType, false);
  this->clearHighsCallbackDataOut();
  this->clearHighsCallbackDataIn();
}